

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateConstant
          (ScalarEvolutionAnalysis *this,int64_t integer)

{
  SEConstantNode *this_00;
  SENode *pSVar1;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_20;
  int64_t local_18;
  int64_t integer_local;
  ScalarEvolutionAnalysis *this_local;
  
  local_18 = integer;
  integer_local = (int64_t)this;
  this_00 = (SEConstantNode *)::operator_new(0x38);
  SEConstantNode::SEConstantNode(this_00,this,local_18);
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &local_20,(pointer)this_00);
  pSVar1 = GetCachedOrAdd(this,&local_20);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_20);
  return pSVar1;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateConstant(int64_t integer) {
  return GetCachedOrAdd(
      std::unique_ptr<SENode>(new SEConstantNode(this, integer)));
}